

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Value * __thiscall cashew::Value::setArray(Value *this,size_t size_hint)

{
  ArrayStorage *pAVar1;
  size_t size_hint_local;
  Value *this_local;
  
  free(this,(void *)size_hint);
  this->type = Array;
  pAVar1 = GlobalMixedArena::alloc<cashew::ArrayStorage>((GlobalMixedArena *)&arena);
  (this->field_1).arr = pAVar1;
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::reserve
            (&((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>,
             size_hint);
  return this;
}

Assistant:

Value& setArray(size_t size_hint = 0) {
    free();
    type = Array;
    arr = arena.alloc<ArrayStorage>();
    arr->reserve(size_hint);
    return *this;
  }